

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceCountQuantity::SurfaceCountQuantity
          (SurfaceCountQuantity *this,string *name,SurfaceMesh *mesh_,string *descriptiveType_)

{
  allocator local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  SurfaceMeshQuantity::SurfaceMeshQuantity(&this->super_SurfaceMeshQuantity,&local_40,mesh_,false);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_SurfaceMeshQuantity).super_Quantity<polyscope::SurfaceMesh>._vptr_Quantity =
       (_func_int **)&PTR__SurfaceCountQuantity_0047dcd0;
  (this->mapper).offset = 0.0;
  (this->mapper).scale = 1.0;
  (this->mapper).minVal = NAN;
  (this->mapper).maxVal = NAN;
  (this->entries).
  super__Vector_base<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->entries).
  super__Vector_base<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entries).
  super__Vector_base<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->NO_INDEX = -0x80000000;
  std::__cxx11::string::string((string *)&this->descriptiveType,(string *)descriptiveType_);
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Quantity<polyscope::SurfaceMesh>::uniquePrefix_abi_cxx11_
            (&local_a0,(Quantity<polyscope::SurfaceMesh> *)this);
  std::operator+(&local_80,&local_a0,"#pointRadius");
  PersistentValue<polyscope::ScaledValue<float>_>::PersistentValue
            (&this->pointRadius,&local_80,(ScaledValue<float>)0x3ba3d70a00000001);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  Quantity<polyscope::SurfaceMesh>::uniquePrefix_abi_cxx11_
            (&local_a0,(Quantity<polyscope::SurfaceMesh> *)this);
  std::operator+(&local_80,&local_a0,"#colorMap");
  std::__cxx11::string::string((string *)&local_60,"coolwarm",&local_a1);
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::PersistentValue(&this->colorMap,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

SurfaceCountQuantity::SurfaceCountQuantity(std::string name, SurfaceMesh& mesh_, std::string descriptiveType_)
    : SurfaceMeshQuantity(name, mesh_), descriptiveType(descriptiveType_),
      pointRadius(uniquePrefix() + "#pointRadius", relativeValue(0.005)),
      colorMap(uniquePrefix() + "#colorMap", "coolwarm") {}